

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O2

string * __thiscall
tinyusdz::prim::print_prim_abi_cxx11_
          (string *__return_storage_ptr__,prim *this,Prim *prim,uint32_t indent)

{
  _Base_ptr *this_00;
  int iVar1;
  Prim *pPVar2;
  Prim *pPVar3;
  string *psVar4;
  ostream *poVar5;
  value_type *pvVar6;
  long lVar7;
  iterator iVar8;
  PrimMeta *pPVar9;
  uint32_t uVar10;
  _Rb_tree_node_base *p_Var11;
  _Base_ptr p_Var12;
  _Rb_tree_node_base *p_Var13;
  pointer pPVar14;
  uint32_t n;
  uint32_t extraout_EDX_00;
  uint32_t extraout_EDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar15;
  undefined8 extraout_RDX_01;
  size_t i_5;
  pointer pPVar16;
  _Base_ptr p_Var17;
  undefined1 in_R8B;
  size_t i;
  ulong uVar18;
  size_t i_1;
  pprint *v;
  long lVar19;
  _Rb_tree_node_base *p_Var20;
  bool bVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>_>
  primNameTable;
  token nameTok;
  string s;
  stringstream ss;
  allocator local_291;
  uint local_290;
  uint local_28c;
  Prim *local_288;
  uint local_27c;
  pprint *local_278;
  undefined1 local_270 [32];
  _Base_ptr local_250;
  size_t local_248;
  string local_240;
  string *local_220;
  _Rb_tree_node_base *local_218;
  _Rb_tree_node_base *local_210;
  _Rb_tree_node_base *local_208;
  _Rb_tree_node_base *local_200;
  string local_1f8;
  string local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  v = (pprint *)((ulong)prim & 0xffffffff);
  local_220 = __return_storage_ptr__;
  ::std::__cxx11::stringstream::stringstream(local_1b8);
  tinyusdz::value::pprint_value_abi_cxx11_
            (&local_1d8,(value *)(this + 0x298),(Value *)v,0,(bool)in_R8B);
  bVar21 = true;
  if ((2 < local_1d8._M_string_length) &&
     (local_1d8._M_dataplus._M_p[local_1d8._M_string_length - 2] == '{')) {
    bVar21 = local_1d8._M_dataplus._M_p[local_1d8._M_string_length - 1] != '\n';
  }
  ::std::operator<<(local_1a8,(string *)&local_1d8);
  uVar10 = (uint32_t)extraout_RDX;
  local_288 = (Prim *)this;
  local_278 = v;
  if (*(long *)(this + 0x348) != 0) {
    uVar15 = extraout_RDX;
    if (bVar21) {
      ::std::operator<<(local_1a8,"\n");
      uVar15 = extraout_RDX_00;
    }
    auVar23._8_8_ = uVar15;
    auVar23._0_8_ = *(undefined8 *)(this + 0x338);
    local_218 = (_Rb_tree_node_base *)(this + 0x328);
    iVar1 = (int)prim;
    local_27c = iVar1 + 1;
    local_28c = iVar1 + 2;
    local_290 = iVar1 + 3;
    while( true ) {
      p_Var11 = auVar23._0_8_;
      uVar10 = auVar23._8_4_;
      if (p_Var11 == local_218) break;
      p_Var13 = p_Var11;
      pprint::Indent_abi_cxx11_((string *)local_270,(pprint *)(ulong)local_27c,uVar10);
      poVar5 = ::std::operator<<(local_1a8,(string *)local_270);
      poVar5 = ::std::operator<<(poVar5,"variantSet ");
      ::std::__cxx11::string::string((string *)&local_1f8,"\"",&local_291);
      quote(&local_240,(string *)(p_Var11 + 1),&local_1f8);
      poVar5 = ::std::operator<<(poVar5,(string *)&local_240);
      ::std::operator<<(poVar5," = {\n");
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      auVar22._8_8_ = extraout_RDX_01;
      auVar22._0_8_ = p_Var11[3]._M_right;
      local_208 = (_Rb_tree_node_base *)&p_Var11[3]._M_parent;
      local_210 = p_Var11;
      while( true ) {
        p_Var11 = auVar22._0_8_;
        uVar10 = (uint32_t)p_Var13;
        if (p_Var11 == local_208) break;
        local_200 = p_Var11 + 1;
        pprint::Indent_abi_cxx11_((string *)local_270,(pprint *)(ulong)local_28c,auVar22._8_4_);
        poVar5 = ::std::operator<<(local_1a8,(string *)local_270);
        ::std::__cxx11::string::string((string *)&local_1f8,"\"",&local_291);
        quote(&local_240,(string *)local_200,&local_1f8);
        ::std::operator<<(poVar5,(string *)&local_240);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        bVar21 = PrimMetas::authored((PrimMetas *)&p_Var11[3]._M_left);
        if (bVar21) {
          ::std::operator<<(local_1a8," (\n");
          print_prim_metas_abi_cxx11_
                    ((string *)local_270,(tinyusdz *)&p_Var11[3]._M_left,
                     (PrimMeta *)(ulong)local_290,uVar10);
          ::std::operator<<(local_1a8,(string *)local_270);
          ::std::__cxx11::string::_M_dispose();
          pprint::Indent_abi_cxx11_((string *)local_270,(pprint *)(ulong)local_28c,n);
          poVar5 = ::std::operator<<(local_1a8,(string *)local_270);
          ::std::operator<<(poVar5,")");
          ::std::__cxx11::string::_M_dispose();
        }
        ::std::operator<<(local_1a8," {\n");
        print_props((string *)local_270,
                    (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                     *)(p_Var11 + 2),local_290);
        ::std::operator<<(local_1a8,(string *)local_270);
        ::std::__cxx11::string::_M_dispose();
        if (*(char *)&p_Var11[0x21]._M_parent == '\x01') {
          this_00 = &p_Var11[0x21]._M_parent;
          pvVar6 = nonstd::optional_lite::
                   optional<std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_>::value
                             ((optional<std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_>
                               *)this_00);
          p_Var17 = p_Var11[0x23]._M_parent;
          p_Var12 = p_Var11[0x23]._M_left;
          if ((long)(pvVar6->super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>).
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(pvVar6->super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>).
                    _M_impl.super__Vector_impl_data._M_start >> 5 !=
              ((long)p_Var12 - (long)p_Var17) / 0x350) goto LAB_0023d29d;
          local_270._8_4_ = _S_red;
          local_270._16_8_ = 0;
          local_270._24_8_ = local_270 + 8;
          local_248 = 0;
          lVar19 = 0;
          local_250 = (_Base_ptr)local_270._24_8_;
          for (uVar18 = 0; uVar18 < (ulong)(((long)p_Var12 - (long)p_Var17) / 0x350);
              uVar18 = uVar18 + 1) {
            local_240._M_dataplus._M_p = (pointer)((long)&p_Var17->_M_color + lVar19);
            ::std::
            _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,tinyusdz::Prim_const*>,std::_Select1st<std::pair<std::__cxx11::string_const,tinyusdz::Prim_const*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::Prim_const*>>>
            ::_M_emplace_unique<std::__cxx11::string_const&,tinyusdz::Prim_const*>
                      ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,tinyusdz::Prim_const*>,std::_Select1st<std::pair<std::__cxx11::string_const,tinyusdz::Prim_const*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::Prim_const*>>>
                        *)local_270,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&p_Var17[0xd]._M_color + lVar19),(Prim **)&local_240);
            p_Var17 = p_Var11[0x23]._M_parent;
            p_Var12 = p_Var11[0x23]._M_left;
            lVar19 = lVar19 + 0x350;
          }
          lVar19 = 0;
          p_Var20 = (_Rb_tree_node_base *)0x0;
          while( true ) {
            pvVar6 = nonstd::optional_lite::
                     optional<std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_>::
                     value((optional<std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_>
                            *)this_00);
            p_Var13 = (_Rb_tree_node_base *)
                      ((long)(pvVar6->
                             super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>).
                             _M_impl.super__Vector_impl_data._M_finish -
                       (long)(pvVar6->
                             super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>).
                             _M_impl.super__Vector_impl_data._M_start >> 5);
            if (p_Var13 <= p_Var20) break;
            pvVar6 = nonstd::optional_lite::
                     optional<std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_>::
                     value((optional<std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_>
                            *)this_00);
            ::std::__cxx11::string::string
                      ((string *)&local_240,
                       (string *)
                       ((long)&(((pvVar6->
                                 super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                 )._M_impl.super__Vector_impl_data._M_start)->str_)._M_dataplus._M_p
                       + lVar19));
            iVar8 = ::std::
                    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>_>
                    ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>_>
                            *)local_270,&local_240);
            if (iVar8._M_node != (_Base_ptr)(local_270 + 8)) {
              print_prim_abi_cxx11_
                        (&local_1f8,*(prim **)(iVar8._M_node + 2),(Prim *)(ulong)local_290,
                         (uint32_t)(_Base_ptr)(local_270 + 8));
              ::std::operator<<(local_1a8,(string *)&local_1f8);
              ::std::__cxx11::string::_M_dispose();
              if (p_Var20 !=
                  (_Rb_tree_node_base *)
                  (((long)p_Var11[0x23]._M_left - (long)p_Var11[0x23]._M_parent) / 0x350 + -1)) {
                ::std::operator<<(local_1a8,"\n");
              }
            }
            ::std::__cxx11::string::_M_dispose();
            p_Var20 = (_Rb_tree_node_base *)((long)&p_Var20->_M_color + 1);
            lVar19 = lVar19 + 0x20;
          }
          ::std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>_>
          ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>_>
                       *)local_270);
          uVar10 = extraout_EDX;
        }
        else {
LAB_0023d29d:
          lVar19 = 0;
          uVar18 = 0;
          while( true ) {
            p_Var13 = (_Rb_tree_node_base *)0x350;
            lVar7 = (long)p_Var11[0x23]._M_left - (long)p_Var11[0x23]._M_parent;
            uVar10 = (uint32_t)(lVar7 % 0x350);
            if ((ulong)(lVar7 / 0x350) <= uVar18) break;
            print_prim_abi_cxx11_
                      ((string *)local_270,
                       (prim *)((long)&(p_Var11[0x23]._M_parent)->_M_color + lVar19),
                       (Prim *)(ulong)local_290,0x350);
            ::std::operator<<(local_1a8,(string *)local_270);
            ::std::__cxx11::string::_M_dispose();
            if (uVar18 != ((long)p_Var11[0x23]._M_left - (long)p_Var11[0x23]._M_parent) / 0x350 - 1U
               ) {
              ::std::operator<<(local_1a8,"\n");
            }
            uVar18 = uVar18 + 1;
            lVar19 = lVar19 + 0x350;
          }
        }
        pprint::Indent_abi_cxx11_((string *)local_270,(pprint *)(ulong)local_28c,uVar10);
        poVar5 = ::std::operator<<(local_1a8,(string *)local_270);
        ::std::operator<<(poVar5,"}\n");
        ::std::__cxx11::string::_M_dispose();
        auVar22 = ::std::_Rb_tree_increment(p_Var11);
      }
      pprint::Indent_abi_cxx11_((string *)local_270,(pprint *)(ulong)local_27c,auVar22._8_4_);
      poVar5 = ::std::operator<<(local_1a8,(string *)local_270);
      ::std::operator<<(poVar5,"}\n");
      ::std::__cxx11::string::_M_dispose();
      auVar23 = ::std::_Rb_tree_increment(local_210);
    }
    bVar21 = true;
  }
  if ((local_288->_children).super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (local_288->_children).super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    if (bVar21) {
      ::std::operator<<(local_1a8,"\n");
    }
    pPVar2 = local_288;
    pPVar9 = Prim::metas(local_288);
    pPVar3 = local_288;
    pPVar16 = (pPVar2->_children).
              super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>._M_impl.
              super__Vector_impl_data._M_start;
    pPVar14 = (pPVar2->_children).
              super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if ((long)(pPVar9->primChildren).
              super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(pPVar9->primChildren).
              super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
              super__Vector_impl_data._M_start >> 5 == ((long)pPVar14 - (long)pPVar16) / 0x350) {
      local_270._24_8_ = local_270 + 8;
      local_270._8_4_ = _S_red;
      local_270._16_8_ = 0;
      local_248 = 0;
      lVar19 = 0;
      local_250 = (_Base_ptr)local_270._24_8_;
      for (uVar18 = 0; uVar18 < (ulong)(((long)pPVar14 - (long)pPVar16) / 0x350);
          uVar18 = uVar18 + 1) {
        local_240._M_dataplus._M_p =
             (pointer)((long)&(pPVar16->_abs_path)._prim_part._M_dataplus + lVar19);
        ::std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,tinyusdz::Prim_const*>,std::_Select1st<std::pair<std::__cxx11::string_const,tinyusdz::Prim_const*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::Prim_const*>>>
        ::_M_emplace_unique<std::__cxx11::string_const&,tinyusdz::Prim_const*>
                  ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,tinyusdz::Prim_const*>,std::_Select1st<std::pair<std::__cxx11::string_const,tinyusdz::Prim_const*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::Prim_const*>>>
                    *)local_270,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&(pPVar16->_elementPath)._prim_part._M_dataplus + lVar19),
                   (Prim **)&local_240);
        pPVar16 = (pPVar2->_children).
                  super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pPVar14 = (pPVar2->_children).
                  super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        lVar19 = lVar19 + 0x350;
      }
      iVar1 = (int)local_278;
      lVar19 = 0;
      uVar18 = 0;
      while( true ) {
        pPVar9 = Prim::metas(local_288);
        if ((ulong)((long)(pPVar9->primChildren).
                          super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                          _M_impl.super__Vector_impl_data._M_finish -
                    (long)(pPVar9->primChildren).
                          super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                          _M_impl.super__Vector_impl_data._M_start >> 5) <= uVar18) break;
        if (uVar18 != 0) {
          ::std::operator<<(local_1a8,"\n");
        }
        pPVar9 = Prim::metas(local_288);
        ::std::__cxx11::string::string
                  ((string *)&local_240,
                   (string *)
                   ((long)&(((pPVar9->primChildren).
                             super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                             _M_impl.super__Vector_impl_data._M_start)->str_)._M_dataplus._M_p +
                   lVar19));
        iVar8 = ::std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>_>
                ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>_>
                        *)local_270,&local_240);
        if (iVar8._M_node != (_Base_ptr)(local_270 + 8)) {
          print_prim_abi_cxx11_
                    (&local_1f8,*(prim **)(iVar8._M_node + 2),(Prim *)(ulong)(iVar1 + 1),
                     (uint32_t)(_Base_ptr)(local_270 + 8));
          ::std::operator<<(local_1a8,(string *)&local_1f8);
          ::std::__cxx11::string::_M_dispose();
        }
        ::std::__cxx11::string::_M_dispose();
        uVar18 = uVar18 + 1;
        lVar19 = lVar19 + 0x20;
      }
      ::std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>_>
                   *)local_270);
      uVar10 = extraout_EDX_00;
    }
    else {
      iVar1 = (int)local_278;
      lVar19 = 0;
      uVar18 = 0;
      while( true ) {
        lVar7 = (long)pPVar14 - (long)pPVar16;
        uVar10 = (uint32_t)(lVar7 % 0x350);
        if ((ulong)(lVar7 / 0x350) <= uVar18) break;
        if (uVar18 != 0) {
          ::std::operator<<(local_1a8,"\n");
          pPVar16 = (pPVar3->_children).
                    super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>._M_impl.
                    super__Vector_impl_data._M_start;
        }
        print_prim_abi_cxx11_
                  ((string *)local_270,
                   (prim *)((long)&(pPVar16->_abs_path)._prim_part._M_dataplus + lVar19),
                   (Prim *)(ulong)(iVar1 + 1),(uint32_t)lVar7);
        ::std::operator<<(local_1a8,(string *)local_270);
        ::std::__cxx11::string::_M_dispose();
        uVar18 = uVar18 + 1;
        pPVar16 = (pPVar3->_children).
                  super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pPVar14 = (pPVar3->_children).
                  super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        lVar19 = lVar19 + 0x350;
      }
    }
  }
  pprint::Indent_abi_cxx11_((string *)local_270,local_278,uVar10);
  poVar5 = ::std::operator<<(local_1a8,(string *)local_270);
  ::std::operator<<(poVar5,"}\n");
  ::std::__cxx11::string::_M_dispose();
  psVar4 = local_220;
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::stringstream::~stringstream(local_1b8);
  return psVar4;
}

Assistant:

std::string print_prim(const Prim &prim, const uint32_t indent) {
  std::stringstream ss;

  // Currently, Prim's elementName is read from name variable in concrete Prim
  // class(e.g. Xform::name).
  // TODO: use prim.elementPath for elementName.
  std::string s = pprint_value(prim.data(), indent, /* closing_brace */ false);

  bool require_newline = true;

  // Check last 2 chars.
  // if it ends with '{\n', no properties are authored so do not emit blank line
  // before printing VariantSet or child Prims.
  if (s.size() > 2) {
    if ((s[s.size() - 2] == '{') && (s[s.size() - 1] == '\n')) {
      require_newline = false;
    }
  }

  ss << s;

  //
  // print variant
  //
  if (prim.variantSets().size()) {
    if (require_newline) {
      ss << "\n";
    }

    // need to add blank line after VariantSet stmt and before child Prims,
    // so set require_newline true
    require_newline = true;

    for (const auto &variantSet : prim.variantSets()) {
      ss << pprint::Indent(indent + 1) << "variantSet "
         << quote(variantSet.first) << " = {\n";

      for (const auto &variantItem : variantSet.second.variantSet) {
        ss << pprint::Indent(indent + 2) << quote(variantItem.first);

        const Variant &variant = variantItem.second;

        if (variant.metas().authored()) {
          ss << " (\n";
          ss << print_prim_metas(variant.metas(), indent + 3);
          ss << pprint::Indent(indent + 2) << ")";
        }

        ss << " {\n";

        ss << print_props(variant.properties(), indent + 3);

        if (variant.metas().variantChildren.has_value() &&
            (variant.metas().variantChildren.value().size() ==
             variant.primChildren().size())) {
          std::map<std::string, const Prim *> primNameTable;
          for (size_t i = 0; i < variant.primChildren().size(); i++) {
            primNameTable.emplace(variant.primChildren()[i].element_name(),
                                  &variant.primChildren()[i]);
          }

          for (size_t i = 0; i < variant.metas().variantChildren.value().size();
               i++) {
            value::token nameTok = variant.metas().variantChildren.value()[i];
            const auto it = primNameTable.find(nameTok.str());
            if (it != primNameTable.end()) {
              ss << print_prim(*(it->second), indent + 3);
              if (i != (variant.primChildren().size() - 1)) {
                ss << "\n";
              }
            } else {
              // TODO: Report warning?
            }
          }

        } else {
          for (size_t i = 0; i < variant.primChildren().size(); i++) {
            ss << print_prim(variant.primChildren()[i], indent + 3);
            if (i != (variant.primChildren().size() - 1)) {
              ss << "\n";
            }
          }
        }

        ss << pprint::Indent(indent + 2) << "}\n";
      }

      ss << pprint::Indent(indent + 1) << "}\n";
    }
  }

  //
  // primChildren
  //
  if (prim.children().size()) {
    if (require_newline) {
      ss << "\n";
      require_newline = false;
    }
    if (prim.metas().primChildren.size() == prim.children().size()) {
      // Use primChildren info to determine the order of the traversal.

      std::map<std::string, const Prim *> primNameTable;
      for (size_t i = 0; i < prim.children().size(); i++) {
        primNameTable.emplace(prim.children()[i].element_name(),
                              &prim.children()[i]);
      }

      for (size_t i = 0; i < prim.metas().primChildren.size(); i++) {
        if (i > 0) {
          ss << "\n";
        }
        value::token nameTok = prim.metas().primChildren[i];
        DCOUT(fmt::format("primChildren  {}/{} = {}", i,
                          prim.metas().primChildren.size(), nameTok.str()));
        const auto it = primNameTable.find(nameTok.str());
        if (it != primNameTable.end()) {
          ss << print_prim(*(it->second), indent + 1);
        } else {
          // TODO: Report warning?
        }
      }

    } else {
      for (size_t i = 0; i < prim.children().size(); i++) {
        if (i > 0) {
          ss << "\n";
        }
        ss << print_prim(prim.children()[i], indent + 1);
      }
    }
  }

  ss << pprint::Indent(indent) << "}\n";

  return ss.str();
}